

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_for::dump(statement_for *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  ulong uVar2;
  _Elt_pointer ptVar3;
  ulong uVar4;
  long lVar5;
  statement_base **ptr;
  _Elt_pointer ppsVar6;
  _Elt_pointer ppsVar7;
  _Map_pointer pppsVar8;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginFor >\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(o,"< Iterator = ",0xd);
  ptVar3 = (this->mParallel).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar2 = (long)ptVar3 -
          (long)(this->mParallel).
                super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
  if (0x3f < uVar2) {
    uVar4 = uVar2 >> 6 | 0xfc00000000000000;
    if (0 < (long)uVar2) {
      uVar4 = uVar2 >> 6;
    }
    ptVar3 = (this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar4] + uVar2 + uVar4 * -0x40;
  }
  compiler_type::dump_expr(ptVar3->mRoot,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n< Condition = ",0x11);
  ptVar3 = (this->mParallel).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar5 = (long)ptVar3 -
          (long)(this->mParallel).
                super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
  uVar2 = lVar5 + 1;
  if (uVar2 < 0x40) {
    ptVar3 = ptVar3 + 1;
  }
  else {
    uVar4 = uVar2 >> 6 | 0xfc00000000000000;
    if (-1 < lVar5) {
      uVar4 = uVar2 >> 6;
    }
    ptVar3 = (this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar4] + uVar2 + uVar4 * -0x40;
  }
  compiler_type::dump_expr(ptVar3->mRoot,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n< Increment = ",0x11);
  ptVar3 = (this->mParallel).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar5 = (long)ptVar3 -
          (long)(this->mParallel).
                super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
  uVar2 = lVar5 + 2;
  if (uVar2 < 0x40) {
    ptVar3 = ptVar3 + 2;
  }
  else {
    uVar4 = uVar2 >> 6 | 0xfc00000000000000;
    if (-2 < lVar5) {
      uVar4 = uVar2 >> 6;
    }
    ptVar3 = (this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar4] + uVar2 + uVar4 * -0x40;
  }
  compiler_type::dump_expr(ptVar3->mRoot,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n< Body >\n",0xc);
  ppsVar6 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar6 != ppsVar1) {
    ppsVar7 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar8 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar6)->_vptr_statement_base[5])(*ppsVar6,o);
      ppsVar6 = ppsVar6 + 1;
      if (ppsVar6 == ppsVar7) {
        ppsVar6 = pppsVar8[1];
        pppsVar8 = pppsVar8 + 1;
        ppsVar7 = ppsVar6 + 0x40;
      }
    } while (ppsVar6 != ppsVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< EndFor >\n",0xb);
  return;
}

Assistant:

void statement_for::dump(std::ostream &o) const
	{
		o << "< BeginFor >\n";
		o << "< Iterator = ";
		compiler_type::dump_expr(mParallel[0].root(), o);
		o << " >\n< Condition = ";
		compiler_type::dump_expr(mParallel[1].root(), o);
		o << " >\n< Increment = ";
		compiler_type::dump_expr(mParallel[2].root(), o);
		o << " >\n< Body >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndFor >\n";
	}